

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

size_t sysbvm_dwarf_encodeStringTupleWithDefaultString
                 (sysbvm_dynarray_t *buffer,sysbvm_tuple_t stringTuple,char *defaultString)

{
  size_t sVar1;
  
  sVar1 = buffer->size;
  if ((((stringTuple & 0xf) == 0 && stringTuple != 0) &&
      ((*(uint *)(stringTuple + 8) & 0x300) == 0x200)) && ((ulong)*(uint *)(stringTuple + 0xc) != 0)
     ) {
    sysbvm_dynarray_addAll(buffer,(ulong)*(uint *)(stringTuple + 0xc),(void *)(stringTuple + 0x10));
    sysbvm_dwarf_encodeByte(buffer,'\0');
  }
  else {
    sysbvm_dwarf_encodeCString(buffer,defaultString);
  }
  return sVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_dwarf_encodeStringTupleWithDefaultString(sysbvm_dynarray_t *buffer, sysbvm_tuple_t stringTuple, const char *defaultString)
{
    size_t offset = buffer->size;
    if(sysbvm_tuple_isBytes(stringTuple) && sysbvm_tuple_getSizeInBytes(stringTuple) > 0)
    {
        sysbvm_dynarray_addAll(buffer, sysbvm_tuple_getSizeInBytes(stringTuple), SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(stringTuple)->bytes);
        sysbvm_dwarf_encodeByte(buffer, 0);
    }
    else
    {
        sysbvm_dwarf_encodeCString(buffer, defaultString);
    }

    return offset;
}